

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

bool __thiscall helics::ActionMessage::from_json_string(ActionMessage *this,string_view data)

{
  string_view str;
  string_view encoded_string;
  string_view encoded_string_00;
  undefined1 uVar1;
  bool bVar2;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  reference offset;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference pvVar9;
  int *in_RDI;
  string_view sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stringd;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool base64_encoding;
  int ii;
  int stringCount;
  json val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd48;
  char (*in_stack_fffffffffffffd58) [9];
  ActionMessage *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffe40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  int *local_120;
  string_view local_118;
  byte local_c1;
  __sv_type local_a0;
  int local_90;
  int local_8c;
  InterfaceHandle local_64;
  InterfaceHandle local_60;
  GlobalFederateId local_5c;
  GlobalFederateId local_58 [22];
  
  sVar10._M_str = in_stack_fffffffffffffdb8;
  sVar10._M_len = in_stack_fffffffffffffdb0;
  fileops::loadJsonStr_abi_cxx11_(sVar10);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  *in_RDI = iVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  in_RDI[1] = iVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  GlobalFederateId::GlobalFederateId(local_58,iVar4);
  in_RDI[2] = local_58[0].gid;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  GlobalFederateId::GlobalFederateId(&local_5c,iVar4);
  in_RDI[4] = local_5c.gid;
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     (in_stack_fffffffffffffd90,
                      (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  InterfaceHandle::InterfaceHandle(&local_60,iVar4);
  in_RDI[3] = local_60.hid;
  offset = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     (in_stack_fffffffffffffd90,
                      (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar5 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  InterfaceHandle::InterfaceHandle(&local_64,iVar5);
  in_RDI[5] = local_64.hid;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  uVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<unsigned_short,unsigned_short>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd40);
  *(unsigned_short *)(in_RDI + 6) = uVar3;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  uVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<unsigned_short,unsigned_short>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd40);
  *(unsigned_short *)((long)in_RDI + 0x1a) = uVar3;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  uVar6 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<unsigned_int,unsigned_int>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd40);
  in_RDI[7] = uVar6;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  lVar8 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<long,long>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffd40);
  TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
            ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8),lVar8);
  if (*in_RDI == 500) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    lVar8 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<long,long>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffd40);
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
              ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10),lVar8);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    lVar8 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<long,long>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffd40);
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
              ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc),lVar8);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    lVar8 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<long,long>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffd40);
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
              ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xe),lVar8);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd48);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60);
  std::__cxx11::string::~string(in_stack_fffffffffffffd40);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      (in_stack_fffffffffffffd90,
                       (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  iVar5 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffd40);
  local_8c = iVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
  for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this_00,(char *)CONCAT44(iVar5,in_stack_fffffffffffffd88));
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)this_00,CONCAT44(iVar5,in_stack_fffffffffffffd88));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd48);
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd40);
    str._M_len._7_1_ = in_stack_fffffffffffffd6f;
    str._M_len._0_7_ = in_stack_fffffffffffffd68;
    str._M_str = (char *)pvVar9;
    setString(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),str);
    std::__cxx11::string::~string(in_stack_fffffffffffffd40);
  }
  local_c1 = 0;
  uVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[9],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if ((bool)uVar1) {
    in_stack_fffffffffffffd60 =
         (ActionMessage *)
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_00,(char *)CONCAT44(iVar5,in_stack_fffffffffffffd88));
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::is_string((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffd60);
    if (bVar2) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this_00,(char *)CONCAT44(iVar5,in_stack_fffffffffffffd88));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd48);
      local_c1 = std::operator==(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(in_stack_fffffffffffffd40);
    }
  }
  if ((local_c1 & 1) != 0) {
    sVar10 = SmallBuffer::to_string((SmallBuffer *)0x5cbf22);
    encoded_string._M_len._4_4_ = iVar4;
    encoded_string._M_len._0_4_ = in_stack_fffffffffffffe40;
    encoded_string._M_str = (char *)pvVar7;
    local_118 = sVar10;
    gmlc::utilities::base64_decode_to_string_abi_cxx11_(encoded_string,(size_t)offset);
    SmallBuffer::operator=
              ((SmallBuffer *)CONCAT17(uVar1,in_stack_fffffffffffffd68),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_str);
    local_120 = in_RDI + 0x28;
    local_128._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffd38);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffd38);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)sVar10._M_str,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_str;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_128);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_str)
      ;
      encoded_string_00._M_len._4_4_ = iVar4;
      encoded_string_00._M_len._0_4_ = in_stack_fffffffffffffe40;
      encoded_string_00._M_str = (char *)pvVar7;
      gmlc::utilities::base64_decode_to_string_abi_cxx11_(encoded_string_00,(size_t)offset);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(iVar5,in_stack_fffffffffffffd88));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_str)
      ;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_128);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffd40);
  return true;
}

Assistant:

bool ActionMessage::from_json_string(std::string_view data)
{
    try {
        auto val = fileops::loadJsonStr(data);
        // auto version = val["version"].asFloat();
        messageAction = static_cast<action_message_def::action_t>(val["command"].get<int32_t>());
        messageID = val["messageId"].get<int32_t>();
        source_id = GlobalFederateId(val["sourceId"].get<int32_t>());
        dest_id = GlobalFederateId(val["destId"].get<int32_t>());
        source_handle = InterfaceHandle(val["sourceHandle"].get<int32_t>());
        dest_handle = InterfaceHandle(val["destHandle"].get<int32_t>());
        counter = val["counter"].get<uint16_t>();
        flags = val["flags"].get<uint16_t>();
        sequenceID = val["sequenceId"].get<uint32_t>();
        actionTime.setBaseTimeCode(val["actionTime"].get<int64_t>());
        if (messageAction == CMD_TIME_REQUEST) {
            Te.setBaseTimeCode(val["Te"].get<int64_t>());
            Tdemin.setBaseTimeCode(val["Tdemin"].get<int64_t>());
            Tso.setBaseTimeCode(val["Tso"].get<int64_t>());
        }
        payload = val["payload"].get<std::string>();
        auto stringCount = val["stringCount"].get<int>();
        stringData.resize(stringCount);
        for (int ii = 0; ii < stringCount; ++ii) {
            setString(ii, val["strings"][ii].get<std::string>());
        }
        bool base64_encoding{false};
        if (val.contains("encoding") && val["encoding"].is_string()) {
            base64_encoding = val["encoding"].get<std::string>() == "base64";
        }
        if (base64_encoding) {
            payload = gmlc::utilities::base64_decode_to_string(payload.to_string());
            for (auto& stringd : stringData) {
                stringd = gmlc::utilities::base64_decode_to_string(stringd);
            }
        }
    }
    catch (...) {
        return false;
    }
    return true;
}